

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

void ma_channel_map_init_blank(ma_channel *pChannelMap,ma_uint32 channels)

{
  if (channels == 0 || pChannelMap == (ma_channel *)0x0) {
    return;
  }
  memset(pChannelMap,0,(ulong)channels);
  return;
}

Assistant:

MA_API void ma_channel_map_init_blank(ma_channel* pChannelMap, ma_uint32 channels)
{
    if (pChannelMap == NULL) {
        return;
    }

    MA_ZERO_MEMORY(pChannelMap, sizeof(*pChannelMap) * channels);
}